

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O2

void __thiscall
module_subset_html_actions::from_path
          (module_subset_html_actions *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *path)

{
  ostream *poVar1;
  pointer pbVar2;
  
  std::operator<<((ostream *)&std::cout,"    <li>");
  for (pbVar2 = (path->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (path->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    if (pbVar2 != (path->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start) {
      std::operator<<((ostream *)&std::cout," &#8674; ");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"<code>");
    poVar1 = std::operator<<(poVar1,(string *)pbVar2);
    std::operator<<(poVar1,"</code>");
  }
  std::operator<<((ostream *)&std::cout,"</li>\n");
  return;
}

Assistant:

void from_path( std::vector<std::string> const & path )
    {
        std::cout << "    <li>";

        for( std::vector<std::string>::const_iterator i = path.begin(); i != path.end(); ++i )
        {
            if( i != path.begin() )
            {
                std::cout << " &#8674; ";
            }

            std::cout << "<code>" << *i << "</code>";
        }

        std::cout << "</li>\n";
    }